

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestTestHandler::SetTestsToRunInformation(cmCTestTestHandler *this,char *in)

{
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  long lVar4;
  char *buff;
  allocator local_249;
  string local_248;
  unsigned_long local_228;
  unsigned_long filelen;
  ifstream fin;
  char *in_local;
  cmCTestTestHandler *this_local;
  
  if (in != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->TestsToRunString,in);
    bVar1 = cmsys::SystemTools::FileExists(in);
    if (bVar1) {
      std::ifstream::ifstream(&filelen,in,_S_in);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_248,in,&local_249);
      uVar2 = cmsys::SystemTools::FileLength(&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      local_228 = uVar2;
      pcVar3 = (char *)operator_new__(uVar2 + 1);
      std::istream::getline((char *)&filelen,(long)pcVar3);
      lVar4 = std::istream::gcount();
      pcVar3[lVar4] = '\0';
      std::__cxx11::string::operator=((string *)&this->TestsToRunString,pcVar3);
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
      }
      std::ifstream::~ifstream(&filelen);
    }
  }
  return;
}

Assistant:

void cmCTestTestHandler::SetTestsToRunInformation(const char* in)
{
  if ( !in )
    {
    return;
    }
  this->TestsToRunString = in;
  // if the argument is a file, then read it and use the contents as the
  // string
  if(cmSystemTools::FileExists(in))
    {
    cmsys::ifstream fin(in);
    unsigned long filelen = cmSystemTools::FileLength(in);
    char* buff = new char[filelen+1];
    fin.getline(buff, filelen);
    buff[fin.gcount()] = 0;
    this->TestsToRunString = buff;
    delete [] buff;
    }
}